

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSRational.hpp
# Opt level: O2

double __thiscall
gte::BSRational<gte::UIntegerFP32<50>>::Convert<unsigned_long,double>
          (BSRational<gte::UIntegerFP32<50>> *this)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  ulong value;
  int i;
  int iVar5;
  int iVar6;
  double dVar7;
  BSNumber<gte::UIntegerFP32<50>_> result;
  BSNumber<gte::UIntegerFP32<50>_> n;
  BSNumber<gte::UIntegerFP32<50>_> two;
  BSNumber<gte::UIntegerFP32<50>_> d;
  BSNumber<gte::UIntegerFP32<50>_> local_1e0;
  BSNumber<gte::UIntegerFP32<50>_> one;
  
  if (*(int *)this != 0) {
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&n,(BSNumber<gte::UIntegerFP32<50>_> *)this);
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&d,(BSNumber<gte::UIntegerFP32<50>_> *)(this + 0xd8))
    ;
    iVar3 = d.mSign * n.mSign;
    n.mSign = 1;
    iVar5 = (n.mBiasedExponent + n.mUInteger.mNumBits) - (d.mBiasedExponent + d.mUInteger.mNumBits);
    n.mBiasedExponent = 1 - n.mUInteger.mNumBits;
    d.mBiasedExponent = 1 - d.mUInteger.mNumBits;
    d.mSign = n.mSign;
    bVar1 = BSNumber<gte::UIntegerFP32<50>_>::LessThanIgnoreSign(&n,&d);
    if (bVar1) {
      n.mBiasedExponent = n.mBiasedExponent + 1;
      iVar5 = iVar5 + -1;
    }
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&one,1);
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&two,2);
    uVar4 = 0x10000000000000;
    value = 0;
    for (iVar6 = 0x34; -1 < iVar6; iVar6 = iVar6 + -1) {
      bVar1 = BSNumber<gte::UIntegerFP32<50>_>::LessThanIgnoreSign(&n,&d);
      if (bVar1) {
        BSNumber<gte::UIntegerFP32<50>_>::operator*(&result,&two,&n);
        BSNumber<gte::UIntegerFP32<50>_>::operator=(&n,&result);
      }
      else {
        BSNumber<gte::UIntegerFP32<50>_>::operator-(&local_1e0,&n,&d);
        BSNumber<gte::UIntegerFP32<50>_>::operator*(&result,&two,&local_1e0);
        BSNumber<gte::UIntegerFP32<50>_>::operator=(&n,&result);
        value = value | uVar4;
      }
      uVar4 = uVar4 >> 1;
    }
    BSNumber<gte::UIntegerFP32<50>_>::operator-(&result,&n,&d);
    BSNumber<gte::UIntegerFP32<50>_>::operator=(&n,&result);
    if ((0 < n.mSign) || ((n.mSign == 0 && ((value & 1) != 0)))) {
      value = value + 1;
    }
    if (value == 0) {
      dVar7 = 0.0;
    }
    else {
      iVar2 = BitHacks::GetTrailingBit(value);
      BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&result,value >> ((byte)iVar2 & 0x3f));
      result.mBiasedExponent = iVar5 + iVar2 + -0x34;
      dVar7 = BSNumber<gte::UIntegerFP32<50>>::
              ConvertTo<gte::IEEEBinary<double,unsigned_long,64,53>>
                        ((BSNumber<gte::UIntegerFP32<50>> *)&result);
      if (iVar3 < 0) {
        dVar7 = -dVar7;
      }
    }
    return dVar7;
  }
  return 0.0;
}

Assistant:

RealType Convert() const
        {
            if (mNumerator.mSign == 0)
            {
                return (RealType)0;
            }

            // The ratio is abstractly of the form (1.u*2^p)/(1.v*2^q).
            // Convert to the form (1.u/1.v)*2^{p-q}, if 1.u >= 1.v, or to the
            // form (2*(1.u)/1.v)*2*{p-q-1}) if 1.u < 1.v.  The final form
            // n/d must be in the interval [1,2).
            BSNumber<UIntegerType> n = mNumerator, d = mDenominator;
            int32_t sign = n.mSign * d.mSign;
            n.mSign = 1;
            d.mSign = 1;
            int32_t pmq = n.GetExponent() - d.GetExponent();
            n.mBiasedExponent = 1 - n.GetUInteger().GetNumBits();
            d.mBiasedExponent = 1 - d.GetUInteger().GetNumBits();
            if (BSNumber<UIntegerType>::LessThanIgnoreSign(n, d))
            {
                ++n.mBiasedExponent;
                --pmq;
            }

            // At this time, n/d = 1.c in [1,2).  Define the sequence of bits
            // w = 1c = w_{imax} w_{imax-1} ... w_0 w_{-1} w_{-2} ... where
            // imax = precision(RealType)-1 and w_{imax} = 1.

            // Compute 'precision' bits for w, the leading bit guaranteed to
            // be 1 and occurring at index (1 << (precision-1)).
            BSNumber<UIntegerType> one(1), two(2);
            int const imax = std::numeric_limits<RealType>::digits - 1;
            UIntType w = 0;
            UIntType mask = ((UIntType)1 << imax);
            for (int i = imax; i >= 0; --i, mask >>= 1)
            {
                if (BSNumber<UIntegerType>::LessThanIgnoreSign(n, d))
                {
                    n = two * n;
                }
                else
                {
                    n = two * (n - d);
                    w |= mask;
                }
            }

            // Apply the mode round-to-nearest-ties-to-even to decide whether
            // to round down or up.  We computed w = w_{imax} ... w_0.  The
            // remainder is n/d = w_{imax+1}.w_{imax+2}... in [0,2).  Compute
            // n'/d = (n-d)/d in [-1,1).  Round-to-nearest-ties-to-even mode
            // is the following, where we need only test the sign of n'.  A
            // remainder of "half" is the case n' = 0.
            //   Round down when n' < 0 or (n' = 0 and w_0 = 0):  use w
            //   Round up when n' > 0 or (n' = 0 and w_0 == 1):  use w+1
            n = n - d;
            if (n.mSign > 0 || (n.mSign == 0 && (w & 1) == 1))
            {
                ++w;
            }

            if (w > 0)
            {
                // Ensure that the low-order bit of w is 1, which is required
                // for the BSNumber integer part.
                int32_t trailing = BitHacks::GetTrailingBit(w);
                w >>= trailing;
                pmq += trailing;

                // Compute a BSNumber with integer part w and the appropriate
                // number of bits and exponents.
                BSNumber<UIntegerType> result(w);
                result.mBiasedExponent = pmq - imax;
                RealType converted = (RealType)result;
                if (sign < 0)
                {
                    converted = -converted;
                }
                return converted;
            }
            else
            {
                return (RealType)0;
            }
        }